

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void kmp_set_disp_num_buffers_(int *arg)

{
  if ((__kmp_init_serial == 0) && (0 < *arg)) {
    __kmp_dispatch_num_buffers = *arg;
    return;
  }
  return;
}

Assistant:

void FTN_STDCALL
FTN_SET_DISP_NUM_BUFFERS( int KMP_DEREF arg )
{
    #ifdef KMP_STUB
        ; // empty routine
    #else
        // ignore after initialization because some teams have already
        // allocated dispatch buffers
        if( __kmp_init_serial == 0 && (KMP_DEREF arg) > 0 )
            __kmp_dispatch_num_buffers = KMP_DEREF arg;
    #endif
}